

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_commodities.cpp
# Opt level: O0

void __thiscall commodities_get_Test::~commodities_get_Test(commodities_get_Test *this)

{
  commodities_get_Test *this_local;
  
  ~commodities_get_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(commodities, get)
{
    auto c = getCommodity("oil");
    EXPECT_EQ(c, commodities::oil);

    c = getCommodity("corn");
    EXPECT_EQ(c, commodities::corn);

    c = getCommodity("soybeans");
    EXPECT_EQ(c, commodities::soybeans);

    c = getCommodity("cells");
    EXPECT_EQ(c, commodities::cell);
}